

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O3

void compare_services(vector<t_service_*,_std::allocator<t_service_*>_> *newServices,
                     vector<t_service_*,_std::allocator<t_service_*>_> *oldServices)

{
  pointer pptVar1;
  mapped_type ptVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  mapped_type *pptVar5;
  undefined4 extraout_var_00;
  iterator iVar6;
  undefined4 extraout_var_01;
  long *plVar7;
  undefined1 *puVar8;
  pointer pptVar9;
  string oldServiceName;
  string oldExtendsName;
  string newExtendsName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
  newServiceMap;
  key_type local_c0;
  undefined1 *local_a0;
  size_t local_98;
  undefined1 local_90 [16];
  undefined1 *local_80;
  size_t local_78;
  undefined1 local_70 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pptVar9 = (newServices->super__Vector_base<t_service_*,_std::allocator<t_service_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pptVar1 = (newServices->super__Vector_base<t_service_*,_std::allocator<t_service_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pptVar9 != pptVar1) {
    do {
      ptVar2 = *pptVar9;
      iVar4 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
      pptVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
                              *)&local_60,(key_type *)CONCAT44(extraout_var,iVar4));
      *pptVar5 = ptVar2;
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 != pptVar1);
  }
  pptVar9 = (oldServices->super__Vector_base<t_service_*,_std::allocator<t_service_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar9 !=
      (oldServices->super__Vector_base<t_service_*,_std::allocator<t_service_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar4 = (*((*pptVar9)->super_t_type).super_t_doc._vptr_t_doc[3])();
      lVar3 = *(long *)CONCAT44(extraout_var_00,iVar4);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,lVar3,((long *)CONCAT44(extraout_var_00,iVar4))[1] + lVar3);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
              ::find(&local_60,&local_c0);
      if ((_Rb_tree_header *)iVar6._M_node == &local_60._M_impl.super__Rb_tree_header) {
        thrift_audit_failure("New Thrift file is missing a service %s\n",local_c0._M_dataplus._M_p);
      }
      else {
        if ((*pptVar9)->extends_ != (t_service *)0x0) {
          plVar7 = *(long **)(*(long *)(iVar6._M_node + 2) + 0xa0);
          if (plVar7 == (long *)0x0) {
            thrift_audit_failure("Change in Service inheritance for %s\n",local_c0._M_dataplus._M_p)
            ;
          }
          else {
            iVar4 = (*((*pptVar9)->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
            local_a0 = local_90;
            lVar3 = *(long *)CONCAT44(extraout_var_01,iVar4);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,lVar3,
                       ((long *)CONCAT44(extraout_var_01,iVar4))[1] + lVar3);
            plVar7 = (long *)(**(code **)(*plVar7 + 0x18))(plVar7);
            local_80 = local_70;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_80,*plVar7,plVar7[1] + *plVar7);
            puVar8 = local_80;
            if ((local_78 != local_98) ||
               ((local_78 != 0 && (iVar4 = bcmp(local_80,local_a0,local_78), iVar4 != 0)))) {
              thrift_audit_failure
                        ("Change in Service inheritance for %s\n",local_c0._M_dataplus._M_p);
              puVar8 = local_80;
            }
            if (puVar8 != local_70) {
              operator_delete(puVar8);
            }
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
          }
        }
        compare_functions((vector<t_function_*,_std::allocator<t_function_*>_> *)
                          (*(long *)(iVar6._M_node + 2) + 0x88),&(*pptVar9)->functions_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             (oldServices->super__Vector_base<t_service_*,_std::allocator<t_service_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void compare_services(const std::vector<t_service*>& newServices, const std::vector<t_service*>& oldServices)
{
   std::vector<t_service*>::const_iterator oldServiceIt;

   std::map<std::string, t_service*> newServiceMap;
   for(auto newService : newServices)
   {
      newServiceMap[newService->get_name()] = newService;
   }


   for(oldServiceIt = oldServices.begin(); oldServiceIt != oldServices.end(); oldServiceIt++)
   {
      const std::string oldServiceName = (*oldServiceIt)->get_name();
      auto newServiceMapIt = newServiceMap.find(oldServiceName);

      if(newServiceMapIt == newServiceMap.end())
      {
         thrift_audit_failure("New Thrift file is missing a service %s\n", oldServiceName.c_str());
      }
      else
      {
         t_service* oldServiceExtends = (*oldServiceIt)->get_extends();
         t_service* newServiceExtends = (newServiceMapIt->second)->get_extends();

         if(oldServiceExtends == nullptr)
         {
            // It is fine to add extends. So if service in older thrift did not have any extends, we are fine.
            // DO Nothing
         }
         else if(oldServiceExtends != nullptr && newServiceExtends == nullptr)
         {
            thrift_audit_failure("Change in Service inheritance for %s\n", oldServiceName.c_str());
         }
         else
         {
            std::string oldExtendsName = oldServiceExtends->get_name();
            std::string newExtendsName = newServiceExtends->get_name();

            if( newExtendsName != oldExtendsName)
            {
               thrift_audit_failure("Change in Service inheritance for %s\n", oldServiceName.c_str());
            }
         }

         compare_functions((newServiceMapIt->second)->get_functions(), (*oldServiceIt)->get_functions());
      }

   }

}